

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cpp
# Opt level: O3

void pbrt::processError(char *errorType,FileLoc *loc,char *message)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Alloc_hider _Var2;
  int iVar3;
  long *plVar4;
  ulong *puVar5;
  string errorString;
  string local_78;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,errorType,(allocator<char> *)&local_38);
  Red(&local_58,&local_78);
  paVar1 = &local_78.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (loc != (FileLoc *)0x0) {
    FileLoc::ToString_abi_cxx11_(&local_38,loc);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_38,0,(char *)0x0,0x4a7cac);
    puVar5 = (ulong *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar5) {
      local_78.field_2._M_allocated_capacity = *puVar5;
      local_78.field_2._8_8_ = plVar4[3];
      local_78._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_78.field_2._M_allocated_capacity = *puVar5;
      local_78._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_78._M_string_length = plVar4[1];
    *plVar4 = (long)puVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_78._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::string::append((char *)&local_58);
  std::__cxx11::string::append((char *)&local_58);
  if (processError(char_const*,pbrt::FileLoc_const*,char_const*)::lastError_abi_cxx11_ == '\0') {
    processError();
  }
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&processError::mutex);
  _Var2._M_p = local_58._M_dataplus._M_p;
  if (iVar3 == 0) {
    if ((local_58._M_string_length !=
         processError(char_const*,pbrt::FileLoc_const*,char_const*)::lastError_abi_cxx11_.
         _M_string_length) ||
       ((local_58._M_string_length != 0 &&
        (iVar3 = bcmp(local_58._M_dataplus._M_p,
                      processError(char_const*,pbrt::FileLoc_const*,char_const*)::
                      lastError_abi_cxx11_._M_dataplus._M_p,local_58._M_string_length), iVar3 != 0))
       )) {
      fprintf(_stderr,"%s\n",_Var2._M_p);
      if (LOGGING_LogLevel < 1) {
        local_78._M_string_length = 0;
        local_78.field_2._M_allocated_capacity =
             local_78.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_78._M_dataplus._M_p = (pointer)paVar1;
        detail::stringPrintfRecursive<std::__cxx11::string&>(&local_78,"%s",&local_58);
        Log(Verbose,
            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/error.cpp"
            ,0x34,local_78._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != paVar1) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
      }
      std::__cxx11::string::_M_assign
                ((string *)
                 &processError(char_const*,pbrt::FileLoc_const*,char_const*)::lastError_abi_cxx11_);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&processError::mutex);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

static void processError(const char *errorType, const FileLoc *loc, const char *message) {
    // Build up an entire formatted error string and print it all at once;
    // this way, if multiple threads are printing messages at once, they
    // don't get jumbled up...
    std::string errorString = Red(errorType);

    if (loc)
        errorString += ": " + loc->ToString();

    errorString += ": ";
    errorString += message;

    // Print the error message (but not more than one time).
    static std::string lastError;
    static std::mutex mutex;
    std::lock_guard<std::mutex> lock(mutex);
    if (errorString != lastError) {
        fprintf(stderr, "%s\n", errorString.c_str());
        LOG_VERBOSE("%s", errorString);
        lastError = errorString;
    }
}